

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::compute_L_6x10
          (Epnp *this,MatrixXd *Ut,Matrix<double,_6,_10,_0,_6,_10> *L_6x10)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  undefined1 *puVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined4 local_258 [4];
  undefined1 local_248 [128];
  undefined4 auStack_1c8 [36];
  undefined4 auStack_138 [36];
  undefined4 auStack_a8 [36];
  undefined4 auStack_18 [2];
  
  pdVar2 = (Ut->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar3 = (Ut->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  puVar10 = local_248;
  lVar11 = 0;
  do {
    uVar14 = 1;
    lVar13 = 0;
    iVar9 = 0;
    iVar12 = 0xb - (int)lVar11;
    do {
      *(double *)(puVar10 + lVar13 + -0x10) =
           *(double *)
            ((long)pdVar2 + (ulong)(uint)(iVar9 * 3) * lVar3 * 8 + (ulong)(uint)(iVar12 * 8)) -
           *(double *)((long)pdVar2 + (int)(uVar14 * 3) * lVar3 * 8 + (ulong)(uint)(iVar12 * 8));
      iVar6 = iVar9 * 3;
      *(double *)(puVar10 + lVar13 + -8) =
           *(double *)
            ((long)pdVar2 + (ulong)(iVar9 * 3 + 1) * lVar3 * 8 + (ulong)(uint)(iVar12 * 8)) -
           *(double *)((long)pdVar2 + (int)(uVar14 * 3 + 1) * lVar3 * 8 + (ulong)(uint)(iVar12 * 8))
      ;
      iVar7 = uVar14 * 3;
      bVar5 = 2 < (int)uVar14;
      uVar1 = uVar14 + 1;
      uVar8 = (ulong)uVar1;
      bVar4 = (int)uVar14 < 3;
      uVar14 = iVar9 + 2;
      if (bVar4) {
        uVar14 = uVar1;
      }
      iVar9 = (uint)bVar5 + iVar9;
      *(double *)(puVar10 + lVar13) =
           *(double *)((long)pdVar2 + (ulong)(iVar6 + 2) * lVar3 * 8 + (ulong)(uint)(iVar12 * 8)) -
           *(double *)((long)pdVar2 + (iVar7 + 2) * lVar3 * 8 + (ulong)(uint)(iVar12 * 8));
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x90);
    lVar11 = lVar11 + 1;
    puVar10 = puVar10 + 0x90;
  } while (lVar11 != 4);
  auVar15 = vgatherdpd_avx512f(*(undefined4 *)((long)local_258 + (long)L_6x10));
  auVar15 = ZEXT4864(auVar15._0_48_);
  auVar16 = vgatherdpd_avx512f(*(undefined4 *)((long)local_258 + uVar8));
  auVar16 = ZEXT4864(auVar16._0_48_);
  auVar17 = vgatherdpd_avx512f(*(undefined4 *)((long)local_258 + (long)puVar10));
  auVar17 = ZEXT4864(auVar17._0_48_);
  auVar18 = vmulpd_avx512f(auVar16,auVar16);
  auVar18 = vfmadd231pd_avx512f(auVar18,auVar15,auVar15);
  auVar18 = vfmadd231pd_avx512f(auVar18,auVar17,auVar17);
  auVar18._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[6];
  auVar18._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[7];
  *(undefined1 (*) [64])
   (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array =
       auVar18;
  auVar18 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_1c8 + (long)L_6x10));
  auVar18 = ZEXT4864(auVar18._0_48_);
  auVar19 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_1c8 + uVar8));
  auVar19 = ZEXT4864(auVar19._0_48_);
  auVar20 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_1c8 + (long)puVar10));
  auVar20 = ZEXT4864(auVar20._0_48_);
  auVar21 = vmulpd_avx512f(auVar16,auVar19);
  auVar21 = vfmadd231pd_avx512f(auVar21,auVar15,auVar18);
  auVar21 = vfmadd231pd_avx512f(auVar21,auVar17,auVar20);
  auVar21 = vaddpd_avx512f(auVar21,auVar21);
  auVar21._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0xc];
  auVar21._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0xd];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 6) = auVar21;
  auVar21 = vmulpd_avx512f(auVar19,auVar19);
  auVar21 = vfmadd231pd_avx512f(auVar21,auVar18,auVar18);
  auVar21 = vfmadd231pd_avx512f(auVar21,auVar20,auVar20);
  auVar22._0_48_ = auVar21._0_48_;
  auVar22._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x12];
  auVar22._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x13];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0xc) = auVar22;
  auVar21 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_138 + (long)L_6x10));
  auVar21 = ZEXT4864(auVar21._0_48_);
  auVar22 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_138 + uVar8));
  auVar22 = ZEXT4864(auVar22._0_48_);
  auVar23 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_138 + (long)puVar10));
  auVar23 = ZEXT4864(auVar23._0_48_);
  auVar24 = vmulpd_avx512f(auVar16,auVar22);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar15,auVar21);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar17,auVar23);
  auVar24 = vaddpd_avx512f(auVar24,auVar24);
  auVar24._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x18];
  auVar24._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x19];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x12) = auVar24;
  auVar24 = vmulpd_avx512f(auVar19,auVar22);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar18,auVar21);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar20,auVar23);
  auVar24 = vaddpd_avx512f(auVar24,auVar24);
  auVar25._0_48_ = auVar24._0_48_;
  auVar25._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x1e];
  auVar25._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x1f];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x18) = auVar25;
  auVar24 = vmulpd_avx512f(auVar22,auVar22);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar21,auVar21);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar23,auVar23);
  auVar26._0_48_ = auVar24._0_48_;
  auVar26._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x24];
  auVar26._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x25];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x1e) = auVar26;
  auVar24 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_a8 + (long)L_6x10));
  auVar24 = ZEXT4864(auVar24._0_48_);
  auVar25 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_a8 + uVar8));
  auVar25 = ZEXT4864(auVar25._0_48_);
  auVar26 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_a8 + (long)puVar10));
  auVar26 = ZEXT4864(auVar26._0_48_);
  auVar16 = vmulpd_avx512f(auVar16,auVar25);
  auVar19 = vmulpd_avx512f(auVar19,auVar25);
  auVar15 = vfmadd231pd_avx512f(auVar16,auVar24,auVar15);
  auVar16 = vfmadd231pd_avx512f(auVar19,auVar24,auVar18);
  auVar15 = vfmadd231pd_avx512f(auVar15,auVar26,auVar17);
  auVar16 = vfmadd231pd_avx512f(auVar16,auVar26,auVar20);
  auVar15 = vaddpd_avx512f(auVar15,auVar15);
  auVar17 = vmulpd_avx512f(auVar22,auVar25);
  auVar18 = vmulpd_avx512f(auVar25,auVar25);
  auVar17 = vfmadd231pd_avx512f(auVar17,auVar24,auVar21);
  auVar18 = vfmadd231pd_avx512f(auVar18,auVar24,auVar24);
  auVar15._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x2a];
  auVar15._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x2b];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x24) = auVar15;
  auVar15 = vaddpd_avx512f(auVar16,auVar16);
  auVar16._0_48_ = auVar15._0_48_;
  auVar16._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x30];
  auVar16._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x31];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x2a) = auVar16;
  auVar15 = vfmadd231pd_avx512f(auVar17,auVar26,auVar23);
  auVar16 = vfmadd231pd_avx512f(auVar18,auVar26,auVar26);
  auVar15 = vaddpd_avx512f(auVar15,auVar15);
  auVar17._0_48_ = auVar15._0_48_;
  auVar17._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x36];
  auVar17._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x37];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x30) = auVar17;
  auVar19._0_48_ = auVar16._0_48_;
  auVar19._48_8_ =
       L_6x10[1].super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>.m_storage.m_data.
       array[0];
  auVar19._56_8_ =
       L_6x10[1].super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>.m_storage.m_data.
       array[1];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x36) = auVar19;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_L_6x10(
    const Eigen::MatrixXd & Ut,
    Eigen::Matrix<double,6,10> & L_6x10 )
{
  double dv[4][6][3];

  for(int i = 0; i < 4; i++)
  {
    int a = 0, b = 1;
    for(int j = 0; j < 6; j++)
    {
      dv[i][j][0] = Ut(11-i,3 * a    ) - Ut(11-i,3 * b);
      dv[i][j][1] = Ut(11-i,3 * a + 1) - Ut(11-i,3 * b + 1);
      dv[i][j][2] = Ut(11-i,3 * a + 2) - Ut(11-i,3 * b + 2);

      b++;
      if (b > 3)
      {
        a++;
        b = a + 1;
      }
    }
  }

  for(int i = 0; i < 6; i++)
  {
    L_6x10(i,0) =        dot(dv[0][i], dv[0][i]);
    L_6x10(i,1) = 2.0f * dot(dv[0][i], dv[1][i]);
    L_6x10(i,2) =        dot(dv[1][i], dv[1][i]);
    L_6x10(i,3) = 2.0f * dot(dv[0][i], dv[2][i]);
    L_6x10(i,4) = 2.0f * dot(dv[1][i], dv[2][i]);
    L_6x10(i,5) =        dot(dv[2][i], dv[2][i]);
    L_6x10(i,6) = 2.0f * dot(dv[0][i], dv[3][i]);
    L_6x10(i,7) = 2.0f * dot(dv[1][i], dv[3][i]);
    L_6x10(i,8) = 2.0f * dot(dv[2][i], dv[3][i]);
    L_6x10(i,9) =        dot(dv[3][i], dv[3][i]);
  }
}